

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O2

void __thiscall BPlusTree::PrintRecordsInNode(BPlusTree *this,shared_ptr<Node> *node)

{
  element_type *peVar1;
  long lVar2;
  BPlusTree *this_00;
  long lVar3;
  ulong uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  lVar3 = 0;
  for (uVar4 = 0; peVar1 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
      lVar2 = (long)(peVar1->ptrs).
                    super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(peVar1->ptrs).
                            super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - lVar2 >> 4);
      uVar4 = uVar4 + 1) {
    this_00 = (BPlusTree *)&stack0xffffffffffffffc0;
    std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0,
               (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)(lVar2 + lVar3));
    PrintRecordOfKey(this_00,(shared_ptr<void> *)&stack0xffffffffffffffc0,
                     (((node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->keys).
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4]);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void BPlusTree::PrintRecordsInNode(std::shared_ptr<Node> node) {
    for (int i = 0; i < node->ptrs.size(); i++) {
        PrintRecordOfKey(node->ptrs[i], node->keys[i]);
    }
}